

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_test.cpp
# Opt level: O0

void __thiscall parse_::test_method(parse_ *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_00;
  bool bVar1;
  lazy_ostream *plVar2;
  argument_order aVar3;
  size_type sVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1070;
  basic_cstring<const_char> local_1010;
  basic_cstring<const_char> local_1000;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ff0;
  element_type local_fd0;
  seed local_fa9;
  value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa8;
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
  local_f88;
  assertion_result local_f60;
  basic_cstring<const_char> local_f48;
  basic_cstring<const_char> local_f38;
  basic_cstring<const_char> local_f28;
  basic_cstring<const_char> local_f18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f08;
  undefined4 local_ee8;
  element_type local_ee4;
  undefined1 local_edd [5];
  binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
  local_ed8;
  assertion_result local_ed0;
  basic_cstring<const_char> local_eb8;
  basic_cstring<const_char> local_ea8;
  basic_cstring<const_char> local_e98;
  basic_cstring<const_char> local_e88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e78;
  byte local_e53;
  bool local_e52;
  value_expr<bool> local_e51;
  assertion_result local_e50;
  basic_cstring<const_char> local_e38;
  basic_cstring<const_char> local_e28;
  undefined1 local_e18 [8];
  type opts_1;
  char *argv_1 [5];
  char arg3_1 [2];
  char arg2_1 [15];
  char arg1_1 [10];
  char arg0_1 [6];
  basic_cstring<const_char> local_d78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d68;
  element_type local_d48;
  seed local_d21;
  value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d20;
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
  local_d00;
  assertion_result local_cd8;
  basic_cstring<const_char> local_cc0;
  basic_cstring<const_char> local_cb0;
  basic_cstring<const_char> local_ca0;
  basic_cstring<const_char> local_c90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c80;
  undefined4 local_c60;
  element_type local_c5c;
  undefined1 local_c55 [5];
  binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
  local_c50;
  assertion_result local_c48;
  basic_cstring<const_char> local_c30;
  basic_cstring<const_char> local_c20;
  basic_cstring<const_char> local_c10;
  basic_cstring<const_char> local_c00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bf0;
  byte local_bcb;
  bool local_bca;
  value_expr<bool> local_bc9;
  assertion_result local_bc8;
  basic_cstring<const_char> local_bb0;
  basic_cstring<const_char> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b88;
  undefined1 local_b80 [8];
  type opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  string local_b20 [32];
  string local_b00 [32];
  iterator local_ae0;
  size_type local_ad8;
  undefined1 local_ad0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  error *e_1;
  basic_cstring<const_char> local_9b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9a8;
  undefined1 local_983;
  bool local_982;
  value_expr<bool> local_981;
  assertion_result local_980;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  type local_948;
  char *local_918;
  char *argv [5];
  char local_8e8 [6];
  char arg3 [2];
  char arg2 [15];
  char arg1 [10];
  char arg0 [6];
  error *e;
  basic_cstring<const_char> local_7c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7b0;
  undefined1 local_78b;
  bool local_78a;
  value_expr<bool> local_789;
  assertion_result local_788;
  basic_cstring<const_char> local_770;
  basic_cstring<const_char> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_748;
  type local_740;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70d;
  undefined1 local_70c;
  allocator local_70b;
  allocator local_70a;
  allocator local_709;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  string local_6e0 [32];
  string local_6c0 [32];
  iterator local_6a0;
  size_type local_698;
  undefined1 local_690 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  allocator local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  allocator local_621;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 local_5fa;
  allocator local_5f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  iterator local_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_5c0;
  allocator local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_55a;
  allocator local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  iterator local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  allocator local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_4b8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_470;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<>_>
  local_380;
  undefined1 local_1e8 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd;
  parse_ *this_local;
  
  cmd.m_arguments.
  super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.read._M_invoker = (_Invoker_type)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8,"parse",&local_4d9);
  std::__cxx11::string::string((string *)&local_510);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_4b8,&local_4d8,&local_510);
  std::initializer_list<char>::initializer_list((initializer_list<char> *)&local_520);
  local_55a = 1;
  local_558 = &local_550;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"help",&local_559);
  local_55a = 0;
  local_530 = &local_550;
  local_528 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"",&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"produce help message",&local_5a9);
  long_names_00._M_len = local_528;
  long_names_00._M_array = local_530;
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  flag<(char)104,void>
            (&local_470,&local_4b8,(initializer_list<char>)local_520,long_names_00,&local_580,
             &local_5a8,normal);
  std::initializer_list<char>::initializer_list((initializer_list<char> *)&local_5c0);
  local_5fa = 1;
  local_5f8 = &local_5f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"optimization",&local_5f9);
  local_5fa = 0;
  local_5d0 = &local_5f0;
  local_5c8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_620,"N",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_648,"optimization level",&local_649);
  long_names._M_len = local_5c8;
  long_names._M_array = local_5d0;
  sVar4 = local_5c8;
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<>,std::tuple<>>
  ::flag<(char)111,int>
            (&local_380,&local_470,(initializer_list<char>)local_5c0,long_names,&local_620,
             &local_648,normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_670,"INPUT-FILE",
             (allocator *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<>>
  ::argument<(char)105,std::__cxx11::string>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1e8,&local_380,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'o',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_380);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  local_1070 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5d0;
  do {
    local_1070 = local_1070 + -1;
    std::__cxx11::string::~string((string *)local_1070);
  } while (local_1070 != &local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_470);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  local_1088 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_530;
  do {
    local_1088 = local_1088 + -1;
    std::__cxx11::string::~string((string *)local_1088);
  } while (local_1088 != &local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_4b8);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  local_70c = 1;
  local_708 = &local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_700,"input.cpp",&local_709);
  local_708 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"--optimization",&local_70a);
  local_708 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"4",&local_70b);
  local_70c = 0;
  local_6a0 = &local_700;
  local_698 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_70d);
  __l_00._M_len = local_698;
  __l_00._M_array = local_6a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_690,__l_00,&local_70d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_70d);
  local_10d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a0;
  do {
    local_10d8 = local_10d8 + -1;
    std::__cxx11::string::~string((string *)local_10d8);
    aVar3 = (argument_order)sVar4;
  } while (local_10d8 != &local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_70b);
  std::allocator<char>::~allocator((allocator<char> *)&local_70a);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  local_748 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_690);
  local_750 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_690);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            (&local_740,(nonsugar *)local_748,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_750,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0,aVar3);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map(&local_740);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_770);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_760,0x20,&local_770);
    local_78b = 0;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_789,&local_78a);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_788,&local_789,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_7c0,"false",5);
    boost::unit_test::operator<<(&local_7b0,plVar2,&local_7c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&e,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    aVar3 = 0xe;
    boost::test_tools::tt_detail::report_assertion(&local_788,&local_7b0,&e,0x20,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7b0);
    boost::test_tools::assertion_result::~assertion_result(&local_788);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_690);
  stack0xfffffffffffff738 = 0x73726170;
  stack0xfffffffffffff728 = 0x70632e7475706e69;
  arg1[0] = 'p';
  arg1[1] = '\0';
  arg2[0] = 'z';
  arg2[1] = 'a';
  arg2[2] = 't';
  arg2[3] = 'i';
  arg2[4] = 'o';
  arg2[5] = 'n';
  arg2[6] = '\0';
  _local_8e8 = 0x6d6974706f2d2d;
  arg3[1] = 'i';
  argv[4]._6_2_ = 0x34;
  local_918 = arg1 + 8;
  argv[0] = arg2 + 8;
  argv[1] = local_8e8;
  argv[2] = (char *)((long)argv + 0x26);
  argv[3] = (char *)0x0;
  nonsugar::
  parse<char,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            (&local_948,(nonsugar *)0x4,(int)&local_918,(char **)local_1e8,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0,aVar3);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map(&local_948);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_968);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_958,0x2d,&local_968);
    local_983 = 0;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_981,&local_982);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_980,&local_981,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_9b8,"false",5);
    boost::unit_test::operator<<(&local_9a8,plVar2,&local_9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&e_1,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    uVar5 = 0xe;
    boost::test_tools::tt_detail::report_assertion(&local_980,&local_9a8,&e_1,0x2d,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9a8);
    boost::test_tools::assertion_result::~assertion_result(&local_980);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  opts.
  super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b40,"input.cpp",
             (allocator *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b20,"--optimization",
             (allocator *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b00,"4",
             (allocator *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 5));
  opts.
  super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = 0;
  local_ae0 = &local_b40;
  local_ad8 = 3;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&opts.
                       super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .value.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_ad8;
  __l._M_array = local_ae0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_ad0,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&opts.
                        super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .value.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 3));
  local_1208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ae0;
  do {
    local_1208 = local_1208 + -1;
    std::__cxx11::string::~string((string *)local_1208);
    aVar3 = (argument_order)uVar5;
  } while (local_1208 != &local_b40);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_b88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_ad0);
  local_b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_ad0);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            ((type *)local_b80,(nonsugar *)local_b88,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_b90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1,aVar3);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_ba0,0x35,&local_bb0);
    bVar1 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
            ::has<(char)104>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                              *)local_b80);
    local_bcb = ~bVar1 & 1;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_bc9,&local_bca);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_bc8,&local_bc9,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c00,"!opts.has<\'h\'>()",0x10);
    boost::unit_test::operator<<(&local_bf0,plVar2,&local_c00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c10,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_bc8,&local_bf0,&local_c10,0x35,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bf0);
    boost::test_tools::assertion_result::~assertion_result(&local_bc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c20,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_c20,0x36,&local_c30);
    local_c5c = nonsugar::
                option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                ::get<(char)111>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                                  *)local_b80);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_c55 + 1),(int *)local_c55);
    local_c60 = 4;
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,int> *)&local_c50,
                 (int *)(local_c55 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
    ::evaluate(&local_c48,&local_c50,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c90,"opts.get<\'o\'>() == 4",0x14);
    boost::unit_test::operator<<(&local_c80,plVar2,&local_c90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca0,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_c48,&local_c80,&local_ca0,0x36,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c80);
    boost::test_tools::assertion_result::~assertion_result(&local_c48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb0,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_cb0,0x37,&local_cc0);
    nonsugar::
    option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
    ::get<(char)105>(&local_d48,
                     (option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                      *)local_b80);
    boost::test_tools::assertion::seed::operator->*(&local_d20,&local_d21,&local_d48);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string>,std::__cxx11::string>
    ::operator==(&local_d00,
                 (expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string>,std::__cxx11::string>
                  *)&local_d20,(char (*) [10])"input.cpp");
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
    ::evaluate(&local_cd8,&local_d00,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d78,"opts.get<\'i\'>() == \"input.cpp\"",0x1e);
    boost::unit_test::operator<<(&local_d68,plVar2,&local_d78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)arg0_1,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    aVar3 = 0xe;
    boost::test_tools::tt_detail::report_assertion(&local_cd8,&local_d68,arg0_1,0x37,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d68);
    boost::test_tools::assertion_result::~assertion_result(&local_cd8);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
    ::~binary_expr(&local_d00);
    boost::test_tools::assertion::
    value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~value_expr(&local_d20);
    std::__cxx11::string::~string((string *)&local_d48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__h_,_void>,_nonsugar::detail::option_pair<char,__o_,_int>,_nonsugar::detail::option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_ad0);
  stack0xfffffffffffff270 = 0x73726170;
  arg1_1[0] = 'p';
  arg1_1[1] = '\0';
  opts_1.
  super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(arg1_1 + 8);
  nonsugar::
  parse<char,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            ((type *)local_e18,(nonsugar *)0x4,(int)&opts_1 + 0x28,(char **)local_1e8,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1,aVar3);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e28,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_e28,0x40,&local_e38);
    bVar1 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
            ::has<(char)104>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                              *)local_e18);
    local_e53 = ~bVar1 & 1;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_e51,&local_e52);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_e50,&local_e51,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e88,"!opts.has<\'h\'>()",0x10);
    boost::unit_test::operator<<(&local_e78,plVar2,&local_e88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e98,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_e50,&local_e78,&local_e98,0x40,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e78);
    boost::test_tools::assertion_result::~assertion_result(&local_e50);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea8,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_eb8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_ea8,0x41,&local_eb8);
    local_ee4 = nonsugar::
                option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                ::get<(char)111>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                                  *)local_e18);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_edd + 1),(int *)local_edd);
    local_ee8 = 4;
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,int> *)&local_ed8,
                 (int *)(local_edd + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
    ::evaluate(&local_ed0,&local_ed8,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f18,"opts.get<\'o\'>() == 4",0x14);
    boost::unit_test::operator<<(&local_f08,plVar2,&local_f18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f28,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_ed0,&local_f08,&local_f28,0x41,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f08);
    boost::test_tools::assertion_result::~assertion_result(&local_ed0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f38,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_f38,0x42,&local_f48);
    nonsugar::
    option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
    ::get<(char)105>(&local_fd0,
                     (option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)111,int>,nonsugar::detail::option_pair<char,(char)105,std::__cxx11::string>>
                      *)local_e18);
    boost::test_tools::assertion::seed::operator->*(&local_fa8,&local_fa9,&local_fd0);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string>,std::__cxx11::string>
    ::operator==(&local_f88,
                 (expression_base<boost::test_tools::assertion::value_expr<std::__cxx11::string>,std::__cxx11::string>
                  *)&local_fa8,(char (*) [10])"input.cpp");
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
    ::evaluate(&local_f60,&local_f88,false);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1000,"opts.get<\'i\'>() == \"input.cpp\"",0x1e);
    boost::unit_test::operator<<(&local_ff0,plVar2,&local_1000);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1010,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_f60,&local_ff0,&local_1010,0x42,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ff0);
    boost::test_tools::assertion_result::~assertion_result(&local_f60);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
    ::~binary_expr(&local_f88);
    boost::test_tools::assertion::
    value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~value_expr(&local_fa8);
    std::__cxx11::string::~string((string *)&local_fd0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__h_,_void>,_nonsugar::detail::option_pair<char,__o_,_int>,_nonsugar::detail::option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e18);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'o',_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_)
{
    using namespace nonsugar;
    auto const cmd = command<char>("parse")
        .flag<'h'>({}, {"help"}, "", "produce help message")
        .flag<'o', int>({}, {"optimization"}, "N", "optimization level")
        .argument<'i', std::string>("INPUT-FILE")
        ;
    {
        std::vector<std::string> const args = { "input.cpp", "--optimization", "4" };
        try {
            parse(args.begin(), args.end(), cmd);
            BOOST_TEST(false);
        } catch (error const &e) {
            BOOST_TEST(e.message() == "parse: unrecognized argument: --optimization");
        }
    }
    {
        char arg0[] = "parse";
        char arg1[] = "input.cpp";
        char arg2[] = "--optimization";
        char arg3[] = "4";
        char *argv[] = { arg0, arg1, arg2, arg3, nullptr };
        try {
            parse(4, argv, cmd);
            BOOST_TEST(false);
        } catch (error const &e) {
            BOOST_TEST(e.message() == "parse: unrecognized argument: --optimization");
        }
    }
    {
        std::vector<std::string> const args = { "input.cpp", "--optimization", "4" };
        auto const opts = parse(args.begin(), args.end(), cmd, argument_order::flexible);
        BOOST_TEST(!opts.has<'h'>());
        BOOST_TEST(opts.get<'o'>() == 4);
        BOOST_TEST(opts.get<'i'>() == "input.cpp");
    }
    {
        char arg0[] = "parse";
        char arg1[] = "input.cpp";
        char arg2[] = "--optimization";
        char arg3[] = "4";
        char *argv[] = { arg0, arg1, arg2, arg3, nullptr };
        auto const opts = parse(4, argv, cmd, argument_order::flexible);
        BOOST_TEST(!opts.has<'h'>());
        BOOST_TEST(opts.get<'o'>() == 4);
        BOOST_TEST(opts.get<'i'>() == "input.cpp");
    }
}